

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void VP8LResidualImage(int width,int height,int bits,int low_effort,uint32_t *argb,
                      uint32_t *argb_scratch,uint32_t *image,int near_lossless_quality,int exact,
                      int used_subtract_green)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  long in_stack_00000008;
  int in_stack_00000010;
  int pred;
  int tile_x;
  int i;
  int max_quantization;
  int histo [4] [256];
  int tile_y;
  int tiles_per_col;
  int tiles_per_row;
  int (*in_stack_00001148) [256];
  int in_stack_00001154;
  int in_stack_00001158;
  int in_stack_0000115c;
  int in_stack_00001160;
  int in_stack_00001164;
  uint32_t *in_stack_00001190;
  uint32_t *in_stack_00001198;
  int in_stack_000011a0;
  int in_stack_000011a8;
  int in_stack_000011b0;
  uint32_t *in_stack_000011b8;
  int local_1054;
  int local_1050;
  undefined1 local_1048 [64];
  uint32_t *in_stack_ffffffffffffeff8;
  uint32_t *in_stack_fffffffffffff000;
  uint32_t *in_stack_fffffffffffff008;
  int in_stack_fffffffffffff014;
  int in_stack_fffffffffffff018;
  int in_stack_fffffffffffff01c;
  int in_stack_fffffffffffff050;
  int in_stack_fffffffffffff058;
  int in_stack_fffffffffffff060;
  int in_stack_fffffffffffff068;
  int local_44;
  
  uVar1 = VP8LSubSampleSize(in_EDI,in_EDX);
  uVar2 = VP8LSubSampleSize(in_ESI,in_EDX);
  VP8LNearLosslessBits(in_stack_00000010);
  if (in_ECX == 0) {
    memset(local_1048,0,0x1000);
    for (local_44 = 0; local_44 < (int)uVar2; local_44 = local_44 + 1) {
      for (local_1054 = 0; local_1054 < (int)uVar1; local_1054 = local_1054 + 1) {
        iVar3 = GetBestPredictorForTile
                          (in_stack_00001164,in_stack_00001160,in_stack_0000115c,in_stack_00001158,
                           in_stack_00001154,in_stack_00001148,in_stack_00001190,in_stack_00001198,
                           in_stack_000011a0,in_stack_000011a8,in_stack_000011b0,in_stack_000011b8);
        *(uint *)(in_stack_00000008 + (long)(int)(local_44 * uVar1 + local_1054) * 4) =
             iVar3 << 8 | 0xff000000;
      }
    }
  }
  else {
    for (local_1050 = 0; local_1050 < (int)(uVar1 * uVar2); local_1050 = local_1050 + 1) {
      *(undefined4 *)(in_stack_00000008 + (long)local_1050 * 4) = 0xff000b00;
    }
  }
  CopyImageWithPrediction
            (in_stack_fffffffffffff01c,in_stack_fffffffffffff018,in_stack_fffffffffffff014,
             in_stack_fffffffffffff008,in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,
             in_stack_fffffffffffff050,in_stack_fffffffffffff058,in_stack_fffffffffffff060,
             in_stack_fffffffffffff068);
  return;
}

Assistant:

void VP8LResidualImage(int width, int height, int bits, int low_effort,
                       uint32_t* const argb, uint32_t* const argb_scratch,
                       uint32_t* const image, int near_lossless_quality,
                       int exact, int used_subtract_green) {
  const int tiles_per_row = VP8LSubSampleSize(width, bits);
  const int tiles_per_col = VP8LSubSampleSize(height, bits);
  int tile_y;
  int histo[4][256];
  const int max_quantization = 1 << VP8LNearLosslessBits(near_lossless_quality);
  if (low_effort) {
    int i;
    for (i = 0; i < tiles_per_row * tiles_per_col; ++i) {
      image[i] = ARGB_BLACK | (kPredLowEffort << 8);
    }
  } else {
    memset(histo, 0, sizeof(histo));
    for (tile_y = 0; tile_y < tiles_per_col; ++tile_y) {
      int tile_x;
      for (tile_x = 0; tile_x < tiles_per_row; ++tile_x) {
        const int pred = GetBestPredictorForTile(width, height, tile_x, tile_y,
            bits, histo, argb_scratch, argb, max_quantization, exact,
            used_subtract_green, image);
        image[tile_y * tiles_per_row + tile_x] = ARGB_BLACK | (pred << 8);
      }
    }
  }

  CopyImageWithPrediction(width, height, bits, image, argb_scratch, argb,
                          low_effort, max_quantization, exact,
                          used_subtract_green);
}